

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const(&)[62],kj::StringPtr,char_const(&)[13],kj::StringPtr,char_const(&)[44],kj::Array<kj::StringTree>,char_const(&)[47],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [62],StringPtr *params_1,
          char (*params_2) [13],StringPtr *params_3,char (*params_4) [44],
          Array<kj::StringTree> *params_5,char (*params_6) [47],StringTree *params_7)

{
  StringTree *params_7_00;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  StringTree local_68;
  
  local_88 = toCharSequence<char_const(&)[62]>((char (*) [62])this);
  local_98.ptr = *(char **)*params;
  local_98.size_ = *(long *)(*params + 8) - 1;
  local_a8 = toCharSequence<char_const(&)[13]>((char (*) [13])params_1);
  local_b8.ptr = *(char **)*params_2;
  local_b8.size_ = *(long *)(*params_2 + 8) - 1;
  local_c8 = toCharSequence<char_const(&)[44]>((char (*) [44])params_3);
  operator*(&local_68,params_4);
  params_7_00 = (StringTree *)0x19b03f;
  local_78 = toCharSequence<char_const(&)[47]>((char (*) [47])params_5);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,(StringTree *)&local_88,&local_98,&local_a8,&local_b8,&local_c8,
             (ArrayPtr<const_char> *)&local_68,(StringTree *)&local_78,
             (ArrayPtr<const_char> *)params_6,params_7_00);
  StringTree::~StringTree(&local_68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}